

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O1

void __thiscall sjtu::TrainManager::refund_ticket(TrainManager *this,orderType *order)

{
  char (*pacVar1) [41];
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  orderType *poVar2;
  char (*pacVar3) [41];
  int iVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  long lVar7;
  ulong uVar8;
  long lVar9;
  stationType *__s;
  bool bVar10;
  ulong uVar11;
  int *piVar12;
  bool bVar13;
  pair<long,_bool> pVar14;
  long *local_e0;
  size_t local_d8;
  long local_d0 [2];
  trainType *local_c0;
  orderType *local_b8;
  long *local_b0;
  size_t local_a8;
  long local_a0 [2];
  TrainManager *local_90;
  char (*local_88) [41];
  long *local_80;
  long local_78;
  long local_70 [2];
  string local_60;
  long local_40;
  undefined1 local_38;
  trainType *this_01;
  
  this_00 = this->TrainBpTree;
  local_80 = local_70;
  sVar6 = strlen(order->trainID);
  local_b8 = order;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,order->trainID,order->trainID + sVar6);
  if (local_78 == 0) {
    local_e0 = (long *)0x0;
  }
  else {
    lVar9 = 0;
    lVar7 = 0;
    uVar8 = 0;
    do {
      uVar11 = (ulong)((int)*(char *)((long)local_80 + lVar9) + 0x100);
      lVar7 = (long)(lVar7 * 0x239 + uVar11) % 0x3b800001;
      uVar8 = (long)(uVar8 * 0x301 + uVar11) % 0x3b9aca07;
      lVar9 = lVar9 + 1;
    } while (local_78 != lVar9);
    local_e0 = (long *)(lVar7 << 0x20 | uVar8);
  }
  pVar14 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                     (this_00,(unsigned_long_long *)&local_e0);
  local_40 = pVar14.first;
  local_38 = pVar14.second;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  iVar4 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[2])
                    (this->TrainFile,&local_40);
  poVar2 = local_b8;
  this_01 = (trainType *)CONCAT44(extraout_var,iVar4);
  iVar4 = timeType::dateminus(local_b8->date,this_01->saleDate);
  pacVar1 = poVar2->station;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  sVar6 = strlen(*pacVar1);
  local_88 = pacVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,pacVar1,poVar2->station[0] + sVar6);
  local_c0 = this_01;
  iVar5 = trainType::get_Delta_date(this_01,&local_60);
  local_90 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_c0->stationNum) {
    __s = local_c0->stations;
    pacVar1 = local_b8->station + 1;
    piVar12 = local_c0->stations[0].seatNum + (iVar5 + iVar4);
    lVar7 = 0;
    bVar10 = false;
    do {
      if (bVar10) {
        *piVar12 = *piVar12 + local_b8->num;
      }
      local_e0 = local_d0;
      sVar6 = strlen(__s->stationName);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,__s,__s->stationName + sVar6);
      local_b0 = local_a0;
      sVar6 = strlen(*pacVar1);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pacVar1,*pacVar1 + sVar6);
      if (local_d8 == local_a8) {
        if (local_d8 == 0) {
          bVar13 = true;
        }
        else {
          iVar4 = bcmp(local_e0,local_b0,local_d8);
          bVar13 = iVar4 == 0;
        }
      }
      else {
        bVar13 = false;
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (bVar13) break;
      local_e0 = local_d0;
      sVar6 = strlen(__s->stationName);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,__s,__s->stationName + sVar6);
      pacVar3 = local_88;
      local_b0 = local_a0;
      sVar6 = strlen(*local_88);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pacVar3,*pacVar3 + sVar6);
      if (local_d8 == local_a8) {
        if (local_d8 == 0) {
          bVar13 = true;
        }
        else {
          iVar4 = bcmp(local_e0,local_b0,local_d8);
          bVar13 = iVar4 == 0;
        }
      }
      else {
        bVar13 = false;
      }
      if (local_b0 != local_a0) {
        operator_delete(local_b0,local_a0[0] + 1);
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
      if (bVar13) {
        bVar10 = true;
      }
      lVar7 = lVar7 + 1;
      piVar12 = piVar12 + 0x6a;
      __s = __s + 1;
    } while (lVar7 < local_c0->stationNum);
  }
  (*(local_90->TrainFile->super_FileManager_Base<sjtu::trainType>)._vptr_FileManager_Base[3])
            (local_90->TrainFile,&local_c0->offset);
  return;
}

Assistant:

void TrainManager::refund_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		trainType *train = TrainFile -> read(ret.first);
		int day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0]));
		bool flag = false;
		for (int i = 0;i < train -> stationNum;++ i)
		{
			if (flag) train -> stations[i].seatNum[day_id] += order -> num;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
		}
		TrainFile -> save(train -> offset);
	}